

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterBuilder.cpp
# Opt level: O3

void __thiscall
slang::ast::ParameterBuilder::setAssignments
          (ParameterBuilder *this,ParameterValueAssignmentSyntax *syntax,bool isFromConfig)

{
  char *pcVar1;
  SyntaxKind SVar2;
  size_t sVar3;
  Scope *pSVar4;
  undefined1 *puVar5;
  long lVar6;
  int iVar7;
  ushort uVar8;
  slot_type *psVar9;
  ParamAssignmentSyntax *pPVar10;
  pointer __x;
  undefined8 uVar11;
  value_type_pointer ppVar12;
  byte bVar13;
  bool bVar14;
  uint uVar15;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar16;
  NamedParamAssignmentSyntax *hash;
  SourceLocation SVar17;
  uint64_t uVar18;
  Diagnostic *pDVar19;
  char_pointer puVar20;
  uint64_t uVar21;
  char_pointer puVar22;
  undefined7 in_register_00000011;
  pointer pPVar23;
  char_pointer puVar24;
  ulong uVar25;
  uint64_t uVar26;
  long lVar27;
  ulong uVar28;
  slot_type *psVar29;
  NamedParamAssignmentSyntax *pNVar30;
  NamedParamAssignmentSyntax *pos0;
  NamedParamAssignmentSyntax *pNVar31;
  group_type_pointer pgVar32;
  group_type_pointer pos0_00;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>
  *ppVar33;
  pointer pPVar34;
  ulong uVar35;
  pointer pPVar36;
  Token *this_00;
  basic_string_view<char,_std::char_traits<char>_> *__y;
  basic_string_view<char,_std::char_traits<char>_> *pbVar37;
  group15<boost::unordered::detail::foa::plain_integral> *pgVar38;
  group15<boost::unordered::detail::foa::plain_integral> *pgVar39;
  table_element_pointer ppVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  uchar uVar47;
  char cVar48;
  uchar uVar49;
  char cVar50;
  uchar uVar51;
  char cVar52;
  byte bVar53;
  uchar uVar54;
  char cVar55;
  uchar uVar56;
  char cVar57;
  uchar uVar58;
  char cVar59;
  byte bVar60;
  uchar uVar61;
  char cVar62;
  uchar uVar63;
  char cVar64;
  uchar uVar65;
  char cVar66;
  byte bVar67;
  uchar uVar68;
  char cVar69;
  uchar uVar70;
  char cVar71;
  uchar uVar72;
  char cVar73;
  byte bVar74;
  iterator iVar75;
  string_view arg;
  string_view name;
  locator res;
  SmallVector<const_slang::syntax::OrderedParamAssignmentSyntax_*,_5UL> orderedParams;
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>,_8UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
  namedParams;
  try_emplace_args_t local_2c9;
  basic_string_view<char,_std::char_traits<char>_> *local_2c8;
  pointer local_2c0;
  NamedParamAssignmentSyntax *local_2b8;
  NamedParamAssignmentSyntax *local_2b0;
  pointer local_2a8;
  group_type_pointer local_2a0;
  string_view local_298;
  undefined4 local_284;
  Token local_280;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>
  *local_270;
  undefined8 local_268;
  char cStack_260;
  char cStack_25f;
  char cStack_25e;
  byte bStack_25d;
  char cStack_25c;
  char cStack_25b;
  char cStack_25a;
  byte bStack_259;
  undefined8 local_258;
  uchar uStack_250;
  uchar uStack_24f;
  uchar uStack_24e;
  byte bStack_24d;
  uchar uStack_24c;
  uchar uStack_24b;
  uchar uStack_24a;
  byte bStack_249;
  undefined8 local_248;
  uchar uStack_240;
  uchar uStack_23f;
  uchar uStack_23e;
  byte bStack_23d;
  uchar uStack_23c;
  uchar uStack_23b;
  uchar uStack_23a;
  byte bStack_239;
  group_type_pointer local_238;
  NamedParamAssignmentSyntax *local_230;
  undefined8 local_228;
  char cStack_220;
  char cStack_21f;
  char cStack_21e;
  byte bStack_21d;
  char cStack_21c;
  char cStack_21b;
  char cStack_21a;
  byte bStack_219;
  long local_210;
  pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool> local_208;
  undefined1 *local_1f8;
  group15<boost::unordered::detail::foa::plain_integral> *local_1f0;
  undefined8 local_1e8;
  undefined1 local_1e0 [40];
  char local_1b8;
  char cStack_1b7;
  char cStack_1b6;
  byte bStack_1b5;
  char cStack_1b4;
  char cStack_1b3;
  char cStack_1b2;
  byte bStack_1b1;
  char cStack_1b0;
  char cStack_1af;
  char cStack_1ae;
  byte bStack_1ad;
  char cStack_1ac;
  char cStack_1ab;
  char cStack_1aa;
  byte bStack_1a9;
  char local_1a8;
  char cStack_1a7;
  char cStack_1a6;
  byte bStack_1a5;
  char cStack_1a4;
  char cStack_1a3;
  char cStack_1a2;
  byte bStack_1a1;
  char cStack_1a0;
  char cStack_19f;
  char cStack_19e;
  byte bStack_19d;
  char cStack_19c;
  char cStack_19b;
  char cStack_19a;
  byte bStack_199;
  uchar local_198;
  uchar uStack_197;
  uchar uStack_196;
  byte bStack_195;
  uchar uStack_194;
  uchar uStack_193;
  uchar uStack_192;
  byte bStack_191;
  uchar uStack_190;
  uchar uStack_18f;
  uchar uStack_18e;
  byte bStack_18d;
  uchar uStack_18c;
  uchar uStack_18b;
  uchar uStack_18a;
  byte bStack_189;
  uchar local_188;
  uchar uStack_187;
  uchar uStack_186;
  byte bStack_185;
  uchar uStack_184;
  uchar uStack_183;
  uchar uStack_182;
  byte bStack_181;
  uchar uStack_180;
  uchar uStack_17f;
  uchar uStack_17e;
  byte bStack_17d;
  uchar uStack_17c;
  uchar uStack_17b;
  uchar uStack_17a;
  byte bStack_179;
  undefined1 local_178 [256];
  Storage *local_78;
  undefined1 local_70 [32];
  value_type_pointer ppStack_50;
  size_ctrl_type local_48;
  
  sVar3 = (syntax->parameters).elements._M_extent._M_extent_value;
  if (sVar3 == 0 && isFromConfig) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
    ::clear((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
             *)&(this->assignments).super_Storage.field_0x108);
    return;
  }
  local_284 = (undefined4)CONCAT71(in_register_00000011,isFromConfig);
  local_1f8 = local_1e0;
  local_1f0 = (group15<boost::unordered::detail::foa::plain_integral> *)0x0;
  local_1e8 = 5;
  local_78 = (Storage *)local_178;
  local_70._8_8_ = 0x3f;
  local_70._16_8_ = 1;
  stack0xffffffffffffffa8 = ZEXT816(0x4619b0);
  local_48.ml = 0;
  local_48.size = 0;
  uVar35 = sVar3 + 1;
  local_70._0_8_ = local_78;
  if (1 < uVar35) {
    local_2c8 = (basic_string_view<char,_std::char_traits<char>_> *)CONCAT71(local_2c8._1_7_,1);
    bVar14 = false;
    uVar25 = 0;
    do {
      ppSVar16 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                           ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                            ((syntax->parameters).elements._M_ptr + uVar25 * 2));
      pNVar31 = (NamedParamAssignmentSyntax *)*ppSVar16;
      SVar2 = (pNVar31->super_ParamAssignmentSyntax).super_SyntaxNode.kind;
      if (bVar14) {
        if ((SVar2 == OrderedParamAssignment) != (bool)((byte)local_2c8 & 1)) {
          pSVar4 = this->scope;
          local_280 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)pNVar31);
          SVar17 = parsing::Token::location(&local_280);
          Scope::addDiag(pSVar4,(DiagCode)0x7f0006,SVar17);
          break;
        }
      }
      else {
        local_2c8 = (basic_string_view<char,_std::char_traits<char>_> *)
                    CONCAT71(local_2c8._1_7_,SVar2 == OrderedParamAssignment);
      }
      if (SVar2 == OrderedParamAssignment) {
        local_280._0_8_ = pNVar31;
        SmallVectorBase<slang::syntax::OrderedParamAssignmentSyntax_const*>::
        emplace_back<slang::syntax::OrderedParamAssignmentSyntax_const*>
                  ((SmallVectorBase<slang::syntax::OrderedParamAssignmentSyntax_const*> *)&local_1f8
                   ,(OrderedParamAssignmentSyntax **)&local_280);
      }
      else {
        local_298 = parsing::Token::valueText(&pNVar31->name);
        if (local_298._M_len != 0) {
          local_208.second = false;
          local_208.first = pNVar31;
          hash = (NamedParamAssignmentSyntax *)
                 hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                           ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                            local_70,&local_298);
          pNVar30 = (NamedParamAssignmentSyntax *)((ulong)hash >> (local_70[8] & 0x3f));
          lVar27 = ((ulong)hash & 0xff) * 4;
          uVar47 = (&UNK_00461acc)[lVar27];
          uVar49 = (&UNK_00461acd)[lVar27];
          uVar51 = (&UNK_00461ace)[lVar27];
          bVar53 = (&UNK_00461acf)[lVar27];
          uVar18 = (uint64_t)((uint)hash & 7);
          uVar28 = 0;
          pos0 = pNVar30;
          uVar54 = uVar47;
          uVar56 = uVar49;
          uVar58 = uVar51;
          bVar60 = bVar53;
          uVar61 = uVar47;
          uVar63 = uVar49;
          uVar65 = uVar51;
          bVar67 = bVar53;
          uVar68 = uVar47;
          uVar70 = uVar49;
          uVar72 = uVar51;
          bVar74 = bVar53;
          do {
            pgVar32 = (group_type_pointer)(local_70._24_8_ + pNVar30 * 0x10);
            local_188 = pgVar32->m[0].n;
            uStack_187 = pgVar32->m[1].n;
            uStack_186 = pgVar32->m[2].n;
            bStack_185 = pgVar32->m[3].n;
            uStack_184 = pgVar32->m[4].n;
            uStack_183 = pgVar32->m[5].n;
            uStack_182 = pgVar32->m[6].n;
            bStack_181 = pgVar32->m[7].n;
            uStack_180 = pgVar32->m[8].n;
            uStack_17f = pgVar32->m[9].n;
            uStack_17e = pgVar32->m[10].n;
            bStack_17d = pgVar32->m[0xb].n;
            uStack_17c = pgVar32->m[0xc].n;
            uStack_17b = pgVar32->m[0xd].n;
            uStack_17a = pgVar32->m[0xe].n;
            bVar13 = pgVar32->m[0xf].n;
            auVar41[0] = -(local_188 == uVar47);
            auVar41[1] = -(uStack_187 == uVar49);
            auVar41[2] = -(uStack_186 == uVar51);
            auVar41[3] = -(bStack_185 == bVar53);
            auVar41[4] = -(uStack_184 == uVar54);
            auVar41[5] = -(uStack_183 == uVar56);
            auVar41[6] = -(uStack_182 == uVar58);
            auVar41[7] = -(bStack_181 == bVar60);
            auVar41[8] = -(uStack_180 == uVar61);
            auVar41[9] = -(uStack_17f == uVar63);
            auVar41[10] = -(uStack_17e == uVar65);
            auVar41[0xb] = -(bStack_17d == bVar67);
            auVar41[0xc] = -(uStack_17c == uVar68);
            auVar41[0xd] = -(uStack_17b == uVar70);
            auVar41[0xe] = -(uStack_17a == uVar72);
            auVar41[0xf] = -(bVar13 == bVar74);
            uVar15 = (uint)(ushort)((ushort)(SUB161(auVar41 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar41 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar41 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar41 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar41 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar41 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar41 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar41 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar41 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar41 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar41 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar41 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar41 >> 0x77,0) & 1) << 0xe);
            bStack_179 = bVar13;
            if (uVar15 != 0) {
              local_258 = CONCAT17(bVar60,CONCAT16(uVar58,CONCAT15(uVar56,CONCAT14(uVar54,CONCAT13(
                                                  bVar53,CONCAT12(uVar51,CONCAT11(uVar49,uVar47)))))
                                                  ));
              local_2a0 = (group_type_pointer)(local_70._24_8_ + pNVar30 * 0x10);
              local_2a8 = (pointer)(ppStack_50 + (long)pNVar30 * 0xf);
              local_2b8 = hash;
              local_2b0 = pNVar30;
              local_268 = uVar18;
              uStack_250 = uVar61;
              uStack_24f = uVar63;
              uStack_24e = uVar65;
              bStack_24d = bVar67;
              uStack_24c = uVar68;
              uStack_24b = uVar70;
              uStack_24a = uVar72;
              bStack_249 = bVar74;
              local_248 = pos0;
              local_228 = uVar28;
              do {
                local_2c0 = (pointer)(ulong)uVar15;
                iVar7 = 0;
                if (uVar15 != 0) {
                  for (; (uVar15 >> iVar7 & 1) == 0; iVar7 = iVar7 + 1) {
                  }
                }
                pbVar37 = (basic_string_view<char,_std::char_traits<char>_> *)
                          ((long)&local_2a8->field_0 + (ulong)(uint)(iVar7 << 5));
                bVar14 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                         operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                     *)local_70,&local_298,pbVar37);
                if (bVar14) {
                  local_2c0 = (pointer)this->scope;
                  SVar17 = parsing::Token::location(&pNVar31->name);
                  pDVar19 = Scope::addDiag((Scope *)local_2c0,(DiagCode)0x320006,SVar17);
                  Diagnostic::operator<<(pDVar19,local_298);
                  SVar17 = parsing::Token::location((Token *)(pbVar37[1]._M_len + 0x28));
                  Diagnostic::addNote(pDVar19,(DiagCode)0xc0001,SVar17);
                  goto LAB_003dc935;
                }
                uVar15 = (uint)local_2c0 - 1 & (uint)local_2c0;
              } while (uVar15 != 0);
              bVar13 = local_2a0->m[0xf].n;
              uVar18 = local_268;
              pNVar30 = local_2b0;
              uVar28 = local_228;
              hash = local_2b8;
              pos0 = local_248;
              uVar47 = (uchar)local_258;
              uVar49 = local_258._1_1_;
              uVar51 = local_258._2_1_;
              bVar53 = local_258._3_1_;
              uVar54 = local_258._4_1_;
              uVar56 = local_258._5_1_;
              uVar58 = local_258._6_1_;
              bVar60 = local_258._7_1_;
              uVar61 = uStack_250;
              uVar63 = uStack_24f;
              uVar65 = uStack_24e;
              bVar67 = bStack_24d;
              uVar68 = uStack_24c;
              uVar70 = uStack_24b;
              uVar72 = uStack_24a;
              bVar74 = bStack_249;
            }
            if (((&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::
                   is_not_overflowed(unsigned_long)::shift)[uVar18] & bVar13) == 0) break;
            lVar27 = uVar28 + 1;
            uVar28 = uVar28 + 1;
            pNVar30 = (NamedParamAssignmentSyntax *)
                      ((ulong)((long)&(pNVar30->super_ParamAssignmentSyntax).super_SyntaxNode.kind +
                              lVar27) & local_70._16_8_);
          } while (uVar28 <= (ulong)local_70._16_8_);
          if (local_48.size < local_48.ml) {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,256ul,16ul>>
            ::
            nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>
                      ((locator *)&local_280,
                       (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,256ul,16ul>>
                        *)local_70,(arrays_type *)(local_70 + 8),(size_t)pos0,(size_t)hash,
                       &local_2c9,&local_298,&local_208);
            local_48.size = local_48.size + 1;
          }
          else {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,256ul,16ul>>
            ::
            unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>
                      ((locator *)&local_280,
                       (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,256ul,16ul>>
                        *)local_70,(size_t)hash,&local_2c9,&local_298,&local_208);
          }
        }
      }
LAB_003dc935:
      uVar25 = uVar25 + 1;
      bVar14 = true;
    } while (uVar25 != uVar35 >> 1);
    if (((ulong)local_2c8 & 1) == 0) {
      sVar3 = (this->parameterDecls)._M_extent._M_extent_value;
      if (sVar3 != 0) {
        pPVar34 = (this->parameterDecls)._M_ptr;
        local_2a8 = pPVar34 + sVar3;
        local_2b8 = (NamedParamAssignmentSyntax *)&(this->assignments).super_Storage.field_0x108;
        local_2b0 = (NamedParamAssignmentSyntax *)&(this->assignments).field_0x110;
LAB_003dd042:
        pbVar37 = &pPVar34->name;
        uVar21 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                           ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                            local_70,pbVar37);
        uVar26 = uVar21 >> (local_70[8] & 0x3f);
        lVar27 = (uVar21 & 0xff) * 4;
        uVar47 = (&UNK_00461acc)[lVar27];
        uVar49 = (&UNK_00461acd)[lVar27];
        uVar51 = (&UNK_00461ace)[lVar27];
        bVar53 = (&UNK_00461acf)[lVar27];
        uVar18 = 0;
        uVar54 = uVar47;
        uVar56 = uVar49;
        uVar58 = uVar51;
        bVar60 = bVar53;
        uVar61 = uVar47;
        uVar63 = uVar49;
        uVar65 = uVar51;
        bVar67 = bVar53;
        uVar68 = uVar47;
        uVar70 = uVar49;
        uVar72 = uVar51;
        bVar74 = bVar53;
        do {
          uVar11 = local_70._24_8_;
          pgVar32 = (group_type_pointer)(local_70._24_8_ + uVar26 * 0x10);
          local_198 = pgVar32->m[0].n;
          uStack_197 = pgVar32->m[1].n;
          uStack_196 = pgVar32->m[2].n;
          bStack_195 = pgVar32->m[3].n;
          uStack_194 = pgVar32->m[4].n;
          uStack_193 = pgVar32->m[5].n;
          uStack_192 = pgVar32->m[6].n;
          bStack_191 = pgVar32->m[7].n;
          uStack_190 = pgVar32->m[8].n;
          uStack_18f = pgVar32->m[9].n;
          uStack_18e = pgVar32->m[10].n;
          bStack_18d = pgVar32->m[0xb].n;
          uStack_18c = pgVar32->m[0xc].n;
          uStack_18b = pgVar32->m[0xd].n;
          uStack_18a = pgVar32->m[0xe].n;
          bVar13 = pgVar32->m[0xf].n;
          auVar45[0] = -(local_198 == uVar47);
          auVar45[1] = -(uStack_197 == uVar49);
          auVar45[2] = -(uStack_196 == uVar51);
          auVar45[3] = -(bStack_195 == bVar53);
          auVar45[4] = -(uStack_194 == uVar54);
          auVar45[5] = -(uStack_193 == uVar56);
          auVar45[6] = -(uStack_192 == uVar58);
          auVar45[7] = -(bStack_191 == bVar60);
          auVar45[8] = -(uStack_190 == uVar61);
          auVar45[9] = -(uStack_18f == uVar63);
          auVar45[10] = -(uStack_18e == uVar65);
          auVar45[0xb] = -(bStack_18d == bVar67);
          auVar45[0xc] = -(uStack_18c == uVar68);
          auVar45[0xd] = -(uStack_18b == uVar70);
          auVar45[0xe] = -(uStack_18a == uVar72);
          auVar45[0xf] = -(bVar13 == bVar74);
          uVar15 = (uint)(ushort)((ushort)(SUB161(auVar45 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar45 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar45 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar45 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar45 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar45 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar45 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar45 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar45 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar45 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar45 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar45 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar45 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar45 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar45 >> 0x77,0) & 1) << 0xe);
          bStack_189 = bVar13;
          if (uVar15 != 0) {
            local_248 = (NamedParamAssignmentSyntax *)
                        CONCAT17(bVar60,CONCAT16(uVar58,CONCAT15(uVar56,CONCAT14(uVar54,CONCAT13(
                                                  bVar53,CONCAT12(uVar51,CONCAT11(uVar49,uVar47)))))
                                                ));
            ppVar12 = ppStack_50;
            local_2c8 = pbVar37;
            local_2c0 = pPVar34;
            local_268 = uVar26;
            local_258 = uVar18;
            uStack_240 = uVar61;
            uStack_23f = uVar63;
            uStack_23e = uVar65;
            bStack_23d = bVar67;
            uStack_23c = uVar68;
            uStack_23b = uVar70;
            uStack_23a = uVar72;
            bStack_239 = bVar74;
            do {
              iVar7 = 0;
              if (uVar15 != 0) {
                for (; (uVar15 >> iVar7 & 1) == 0; iVar7 = iVar7 + 1) {
                }
              }
              __y = (basic_string_view<char,_std::char_traits<char>_> *)
                    ((long)&ppVar12[uVar26 * 0xf].first._M_len + (ulong)(uint)(iVar7 << 5));
              bVar14 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                       operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                   *)local_70,local_2c8,__y);
              pPVar34 = local_2c0;
              pbVar37 = local_2c8;
              if (bVar14) {
                *(undefined1 *)&__y[1]._M_str = 1;
                if (local_2c0->isLocalParam == true) {
                  bVar14 = local_2c0->isPortParam;
                  pSVar4 = this->scope;
                  SVar17 = parsing::Token::location((Token *)(__y[1]._M_len + 0x28));
                  pDVar19 = Scope::addDiag(pSVar4,(DiagCode)((uint)bVar14 * 0x10000 + 0x30006),
                                           SVar17);
                  Diagnostic::addNote(pDVar19,(DiagCode)0x50001,
                                      *(SourceLocation *)&(pPVar34->location).field_0x0);
                  goto LAB_003dd38f;
                }
                local_248 = *(NamedParamAssignmentSyntax **)(__y[1]._M_len + 0x48);
                uVar18 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                         operator()((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                     *)local_2b8,local_2c8);
                pgVar32 = (group_type_pointer)
                          (uVar18 >>
                          ((char)(local_2b0->super_ParamAssignmentSyntax).super_SyntaxNode.kind &
                          CaseStatement));
                lVar27 = (uVar18 & 0xff) * 4;
                cVar48 = (&UNK_00461acc)[lVar27];
                cVar50 = (&UNK_00461acd)[lVar27];
                cVar52 = (&UNK_00461ace)[lVar27];
                bVar53 = (&UNK_00461acf)[lVar27];
                uVar35 = (ulong)((uint)uVar18 & 7);
                pNVar31 = (NamedParamAssignmentSyntax *)0x0;
                pos0_00 = pgVar32;
                cVar55 = cVar48;
                cVar57 = cVar50;
                cVar59 = cVar52;
                bVar60 = bVar53;
                cVar62 = cVar48;
                cVar64 = cVar50;
                cVar66 = cVar52;
                bVar67 = bVar53;
                cVar69 = cVar48;
                cVar71 = cVar50;
                cVar73 = cVar52;
                bVar74 = bVar53;
                goto LAB_003dd22b;
              }
              uVar15 = uVar15 - 1 & uVar15;
            } while (uVar15 != 0);
            bVar13 = ((group_type_pointer)(uVar11 + uVar26 * 0x10))->m[0xf].n;
            uVar18 = local_258;
            uVar26 = local_268;
            uVar47 = (uchar)local_248;
            uVar49 = local_248._1_1_;
            uVar51 = local_248._2_1_;
            bVar53 = local_248._3_1_;
            uVar54 = local_248._4_1_;
            uVar56 = local_248._5_1_;
            uVar58 = local_248._6_1_;
            bVar60 = local_248._7_1_;
            uVar61 = uStack_240;
            uVar63 = uStack_23f;
            uVar65 = uStack_23e;
            bVar67 = bStack_23d;
            uVar68 = uStack_23c;
            uVar70 = uStack_23b;
            uVar72 = uStack_23a;
            bVar74 = bStack_239;
          }
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[(uint)uVar21 & 7] & bVar13) == 0) break;
          lVar27 = uVar26 + uVar18;
          uVar18 = uVar18 + 1;
          uVar26 = lVar27 + 1U & local_70._16_8_;
        } while (uVar18 <= (ulong)local_70._16_8_);
        goto LAB_003dd38f;
      }
LAB_003dcf0a:
      iVar75 = boost::unordered::detail::foa::
               table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
               ::begin((table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
                        *)local_70);
      if (iVar75.p_ != (table_element_pointer)0x0) {
LAB_003dcf27:
        do {
          if ((((iVar75.p_)->second).second & 1U) == 0) {
            pSVar4 = this->scope;
            this_00 = &(((iVar75.p_)->second).first)->name;
            SVar17 = parsing::Token::location(this_00);
            pDVar19 = Scope::addDiag(pSVar4,(DiagCode)0x990006,SVar17);
            arg = parsing::Token::valueText(this_00);
            Diagnostic::operator<<(pDVar19,arg);
            Diagnostic::operator<<(pDVar19,this->definitionName);
          }
          puVar22 = iVar75.pc_ + 0x12;
          puVar24 = iVar75.pc_ + 2;
          while( true ) {
            puVar20 = puVar24;
            puVar24 = iVar75.pc_;
            ppVar40 = iVar75.p_ + 1;
            if (((uint)iVar75.pc_ & 0xf) == 0xe) break;
            iVar75.p_ = ppVar40;
            iVar75.pc_ = puVar24 + 1;
            puVar22 = puVar22 + 1;
            puVar24 = puVar20 + 1;
            if (puVar20[-1] != '\0') goto code_r0x003dcfa1;
          }
          auVar43[0] = -(*puVar20 == '\0');
          auVar43[1] = -(puVar20[1] == '\0');
          auVar43[2] = -(puVar20[2] == '\0');
          auVar43[3] = -(puVar20[3] == '\0');
          auVar43[4] = -(puVar20[4] == '\0');
          auVar43[5] = -(puVar20[5] == '\0');
          auVar43[6] = -(puVar20[6] == '\0');
          auVar43[7] = -(puVar20[7] == '\0');
          auVar43[8] = -(puVar20[8] == '\0');
          auVar43[9] = -(puVar20[9] == '\0');
          auVar43[10] = -(puVar20[10] == '\0');
          auVar43[0xb] = -(puVar20[0xb] == '\0');
          auVar43[0xc] = -(puVar20[0xc] == '\0');
          auVar43[0xd] = -(puVar20[0xd] == '\0');
          auVar43[0xe] = -(puVar20[0xe] == '\0');
          auVar43[0xf] = -(puVar20[0xf] == '\0');
          uVar8 = (ushort)(SUB161(auVar43 >> 7,0) & 1) | (ushort)(SUB161(auVar43 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar43 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar43 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar43 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar43 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar43 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar43 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar43 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar43 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar43 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar43 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar43 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar43 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar43 >> 0x77,0) & 1) << 0xe;
          while (uVar8 == 0x7fff) {
            ppVar40 = ppVar40 + 0xf;
            auVar44[0] = -(*puVar22 == '\0');
            auVar44[1] = -(puVar22[1] == '\0');
            auVar44[2] = -(puVar22[2] == '\0');
            auVar44[3] = -(puVar22[3] == '\0');
            auVar44[4] = -(puVar22[4] == '\0');
            auVar44[5] = -(puVar22[5] == '\0');
            auVar44[6] = -(puVar22[6] == '\0');
            auVar44[7] = -(puVar22[7] == '\0');
            auVar44[8] = -(puVar22[8] == '\0');
            auVar44[9] = -(puVar22[9] == '\0');
            auVar44[10] = -(puVar22[10] == '\0');
            auVar44[0xb] = -(puVar22[0xb] == '\0');
            auVar44[0xc] = -(puVar22[0xc] == '\0');
            auVar44[0xd] = -(puVar22[0xd] == '\0');
            auVar44[0xe] = -(puVar22[0xe] == '\0');
            auVar44[0xf] = -(puVar22[0xf] == '\0');
            puVar20 = puVar22;
            puVar22 = puVar22 + 0x10;
            uVar8 = (ushort)(SUB161(auVar44 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar44 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar44 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar44 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar44 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar44 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar44 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar44 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar44 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar44 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar44 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar44 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar44 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar44 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar44 >> 0x77,0) & 1) << 0xe;
          }
          uVar15 = 0;
          if ((uVar8 ^ 0x7fff) != 0) {
            for (; ((uVar8 ^ 0x7fff) >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
            }
          }
          if (puVar20[uVar15] == '\x01') break;
          iVar75.p_ = (table_element_pointer)((long)&(ppVar40->first)._M_len + (ulong)(uVar15 << 5))
          ;
          iVar75.pc_ = puVar20 + uVar15;
        } while( true );
      }
      goto LAB_003dcebc;
    }
  }
  sVar3 = (this->parameterDecls)._M_extent._M_extent_value;
  pgVar38 = (group15<boost::unordered::detail::foa::plain_integral> *)0x0;
  if (sVar3 != 0) {
    pPVar36 = (this->parameterDecls)._M_ptr;
    pPVar23 = pPVar36 + sVar3;
    local_2c8 = (basic_string_view<char,_std::char_traits<char>_> *)
                &(this->assignments).super_Storage.field_0x108;
    pPVar34 = (pointer)&(this->assignments).field_0x110;
    do {
      uVar15 = (uint)pgVar38;
      if (local_1f0 <= pgVar38) break;
      pgVar39 = pgVar38;
      if (pPVar36->isLocalParam == false) {
        pgVar39 = (group15<boost::unordered::detail::foa::plain_integral> *)(ulong)(uVar15 + 1);
        local_2b8 = *(NamedParamAssignmentSyntax **)
                     (*(long *)(local_1f8 + (long)pgVar38 * 8) + 0x18);
        local_2c0 = (pointer)&pPVar36->name;
        uVar18 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                           ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                            local_2c8,(basic_string_view<char,_std::char_traits<char>_> *)local_2c0)
        ;
        pNVar31 = (NamedParamAssignmentSyntax *)(uVar18 >> (*(byte *)&pPVar34->field_0 & 0x3f));
        lVar27 = (uVar18 & 0xff) * 4;
        cVar48 = (&UNK_00461acc)[lVar27];
        cVar50 = (&UNK_00461acd)[lVar27];
        cVar52 = (&UNK_00461ace)[lVar27];
        bVar53 = (&UNK_00461acf)[lVar27];
        pgVar32 = (group_type_pointer)(ulong)((uint)uVar18 & 7);
        psVar29 = (slot_type *)0x0;
        pNVar30 = pNVar31;
        cVar55 = cVar48;
        cVar57 = cVar50;
        cVar59 = cVar52;
        bVar60 = bVar53;
        cVar62 = cVar48;
        cVar64 = cVar50;
        cVar66 = cVar52;
        bVar67 = bVar53;
        cVar69 = cVar48;
        cVar71 = cVar50;
        cVar73 = cVar52;
        bVar74 = bVar53;
        local_2a8 = pPVar34;
        do {
          __x = local_2c0;
          lVar27 = *(long *)&(this->assignments).field_0x120;
          pcVar1 = (char *)(lVar27 + (long)pNVar31 * 0x10);
          local_1b8 = *pcVar1;
          cStack_1b7 = pcVar1[1];
          cStack_1b6 = pcVar1[2];
          bStack_1b5 = pcVar1[3];
          cStack_1b4 = pcVar1[4];
          cStack_1b3 = pcVar1[5];
          cStack_1b2 = pcVar1[6];
          bStack_1b1 = pcVar1[7];
          cStack_1b0 = pcVar1[8];
          cStack_1af = pcVar1[9];
          cStack_1ae = pcVar1[10];
          bStack_1ad = pcVar1[0xb];
          cStack_1ac = pcVar1[0xc];
          cStack_1ab = pcVar1[0xd];
          cStack_1aa = pcVar1[0xe];
          bVar13 = pcVar1[0xf];
          auVar42[0] = -(local_1b8 == cVar48);
          auVar42[1] = -(cStack_1b7 == cVar50);
          auVar42[2] = -(cStack_1b6 == cVar52);
          auVar42[3] = -(bStack_1b5 == bVar53);
          auVar42[4] = -(cStack_1b4 == cVar55);
          auVar42[5] = -(cStack_1b3 == cVar57);
          auVar42[6] = -(cStack_1b2 == cVar59);
          auVar42[7] = -(bStack_1b1 == bVar60);
          auVar42[8] = -(cStack_1b0 == cVar62);
          auVar42[9] = -(cStack_1af == cVar64);
          auVar42[10] = -(cStack_1ae == cVar66);
          auVar42[0xb] = -(bStack_1ad == bVar67);
          auVar42[0xc] = -(cStack_1ac == cVar69);
          auVar42[0xd] = -(cStack_1ab == cVar71);
          auVar42[0xe] = -(cStack_1aa == cVar73);
          auVar42[0xf] = -(bVar13 == bVar74);
          uVar15 = (uint)(ushort)((ushort)(SUB161(auVar42 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar42 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar42 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar42 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar42 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar42 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar42 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar42 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar42 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar42 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar42 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar42 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar42 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar42 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar42 >> 0x77,0) & 1) << 0xe);
          bStack_1a9 = bVar13;
          if (uVar15 != 0) {
            local_228 = CONCAT17(bVar60,CONCAT16(cVar59,CONCAT15(cVar57,CONCAT14(cVar55,CONCAT13(
                                                  bVar53,CONCAT12(cVar52,CONCAT11(cVar50,cVar48)))))
                                                ));
            local_210 = lVar27 + (long)pNVar31 * 0x10;
            local_258 = *(long *)&(this->assignments).field_0x128 + (long)pNVar31 * 0x1e0;
            local_2b0 = pNVar30;
            local_2a0 = pgVar32;
            local_268 = uVar18;
            local_238 = (group_type_pointer)psVar29;
            local_230 = pNVar31;
            cStack_220 = cVar62;
            cStack_21f = cVar64;
            cStack_21e = cVar66;
            bStack_21d = bVar67;
            cStack_21c = cVar69;
            cStack_21b = cVar71;
            cStack_21a = cVar73;
            bStack_219 = bVar74;
            do {
              local_248 = (NamedParamAssignmentSyntax *)(ulong)uVar15;
              iVar7 = 0;
              if (uVar15 != 0) {
                for (; (uVar15 >> iVar7 & 1) == 0; iVar7 = iVar7 + 1) {
                }
              }
              ppVar33 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>
                         *)((uint)(iVar7 << 5) + local_258);
              bVar14 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                       operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                   *)local_2c8,
                                  (basic_string_view<char,_std::char_traits<char>_> *)__x,
                                  (basic_string_view<char,_std::char_traits<char>_> *)ppVar33);
              if (bVar14) goto LAB_003dce07;
              uVar15 = (uint)local_248 - 1 & (uint)local_248;
            } while (uVar15 != 0);
            bVar13 = *(byte *)(local_210 + 0xf);
            pgVar32 = local_2a0;
            pNVar31 = local_230;
            psVar29 = local_238->m;
            uVar18 = local_268;
            pNVar30 = local_2b0;
            pPVar34 = local_2a8;
            cVar48 = (char)local_228;
            cVar50 = local_228._1_1_;
            cVar52 = local_228._2_1_;
            bVar53 = local_228._3_1_;
            cVar55 = local_228._4_1_;
            cVar57 = local_228._5_1_;
            cVar59 = local_228._6_1_;
            bVar60 = local_228._7_1_;
            cVar62 = cStack_220;
            cVar64 = cStack_21f;
            cVar66 = cStack_21e;
            bVar67 = bStack_21d;
            cVar69 = cStack_21c;
            cVar71 = cStack_21b;
            cVar73 = cStack_21a;
            bVar74 = bStack_219;
          }
          if ((pgVar32[0x461ec].m[0].n & bVar13) == 0) break;
          puVar5 = *(undefined1 **)&(this->assignments).field_0x118;
          psVar9 = ((group_type_pointer)psVar29)->m;
          psVar29 = ((group_type_pointer)psVar29)->m + 1;
          pNVar31 = (NamedParamAssignmentSyntax *)
                    ((ulong)(psVar9 + (long)((long)&(pNVar31->super_ParamAssignmentSyntax).
                                                    super_SyntaxNode.kind + 1)) & (ulong)puVar5);
        } while (psVar29 <= puVar5);
        if (*(ulong *)&(this->assignments).field_0x138 < *(ulong *)&(this->assignments).field_0x130)
        {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,256ul,16ul>>
          ::
          nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
                    ((locator *)&local_280,
                     (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,256ul,16ul>>
                      *)local_2c8,(arrays_type *)pPVar34,(size_t)pNVar30,uVar18,
                     (try_emplace_args_t *)&local_298,
                     (basic_string_view<char,_std::char_traits<char>_> *)local_2c0);
          puVar5 = &(this->assignments).field_0x138;
          *(long *)puVar5 = *(long *)puVar5 + 1;
          ppVar33 = local_270;
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,256ul,16ul>>
          ::
          unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
                    ((locator *)&local_280,
                     (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,256ul,16ul>>
                      *)local_2c8,uVar18,(try_emplace_args_t *)&local_298,
                     (basic_string_view<char,_std::char_traits<char>_> *)local_2c0);
          ppVar33 = local_270;
        }
LAB_003dce07:
        (ppVar33->second).first = local_2b8;
        (ppVar33->second).second = SUB41(local_284,0);
        pPVar34 = local_2a8;
      }
      uVar15 = (uint)pgVar39;
      pPVar36 = pPVar36 + 1;
      pgVar38 = pgVar39;
    } while (pPVar36 != pPVar23);
    pgVar38 = (group15<boost::unordered::detail::foa::plain_integral> *)(ulong)uVar15;
  }
  if (pgVar38 < local_1f0) {
    local_280 = slang::syntax::SyntaxNode::getFirstToken
                          (*(SyntaxNode **)(local_1f8 + (long)pgVar38 * 8));
    SVar17 = parsing::Token::location(&local_280);
    pDVar19 = Scope::addDiag(this->scope,(DiagCode)0xc70006,SVar17);
    Diagnostic::operator<<(pDVar19,this->definitionName);
    local_280._0_8_ = local_1f0;
    std::
    vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
    ::emplace_back<unsigned_long>(&pDVar19->args,(unsigned_long *)&local_280);
    local_280._0_8_ = pgVar38;
    std::
    vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
    ::emplace_back<unsigned_long>(&pDVar19->args,(unsigned_long *)&local_280);
  }
LAB_003dcebc:
  boost::unordered::detail::foa::
  table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
  ::delete_((allocator_type)local_70._0_8_,
            (table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
             *)(local_70 + 8));
  if (local_1f8 != local_1e0) {
    operator_delete(local_1f8);
  }
  return;
  while( true ) {
    pNVar30 = *(NamedParamAssignmentSyntax **)&(this->assignments).field_0x118;
    pPVar10 = &pNVar31->super_ParamAssignmentSyntax;
    pNVar31 = (NamedParamAssignmentSyntax *)
              ((long)&(pNVar31->super_ParamAssignmentSyntax).super_SyntaxNode.kind + 1);
    pgVar32 = (group_type_pointer)
              ((ulong)(pgVar32->m + 1 + (long)&pPVar10->super_SyntaxNode) & (ulong)pNVar30);
    if (pNVar30 < pNVar31) break;
LAB_003dd22b:
    lVar27 = *(long *)&(this->assignments).field_0x120;
    pcVar1 = (char *)(lVar27 + (long)pgVar32 * 0x10);
    local_1a8 = *pcVar1;
    cStack_1a7 = pcVar1[1];
    cStack_1a6 = pcVar1[2];
    bStack_1a5 = pcVar1[3];
    cStack_1a4 = pcVar1[4];
    cStack_1a3 = pcVar1[5];
    cStack_1a2 = pcVar1[6];
    bStack_1a1 = pcVar1[7];
    cStack_1a0 = pcVar1[8];
    cStack_19f = pcVar1[9];
    cStack_19e = pcVar1[10];
    bStack_19d = pcVar1[0xb];
    cStack_19c = pcVar1[0xc];
    cStack_19b = pcVar1[0xd];
    cStack_19a = pcVar1[0xe];
    bVar13 = pcVar1[0xf];
    auVar46[0] = -(local_1a8 == cVar48);
    auVar46[1] = -(cStack_1a7 == cVar50);
    auVar46[2] = -(cStack_1a6 == cVar52);
    auVar46[3] = -(bStack_1a5 == bVar53);
    auVar46[4] = -(cStack_1a4 == cVar55);
    auVar46[5] = -(cStack_1a3 == cVar57);
    auVar46[6] = -(cStack_1a2 == cVar59);
    auVar46[7] = -(bStack_1a1 == bVar60);
    auVar46[8] = -(cStack_1a0 == cVar62);
    auVar46[9] = -(cStack_19f == cVar64);
    auVar46[10] = -(cStack_19e == cVar66);
    auVar46[0xb] = -(bStack_19d == bVar67);
    auVar46[0xc] = -(cStack_19c == cVar69);
    auVar46[0xd] = -(cStack_19b == cVar71);
    auVar46[0xe] = -(cStack_19a == cVar73);
    auVar46[0xf] = -(bVar13 == bVar74);
    uVar15 = (uint)(ushort)((ushort)(SUB161(auVar46 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar46 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar46 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar46 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar46 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar46 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar46 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar46 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar46 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar46 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar46 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar46 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar46 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar46 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar46 >> 0x77,0) & 1) << 0xe);
    bStack_199 = bVar13;
    if (uVar15 != 0) {
      local_268 = CONCAT17(bVar60,CONCAT16(cVar59,CONCAT15(cVar57,CONCAT14(cVar55,CONCAT13(bVar53,
                                                  CONCAT12(cVar52,CONCAT11(cVar50,cVar48)))))));
      lVar6 = *(long *)&(this->assignments).field_0x128;
      local_2a0 = pgVar32;
      cStack_260 = cVar62;
      cStack_25f = cVar64;
      cStack_25e = cVar66;
      bStack_25d = bVar67;
      cStack_25c = cVar69;
      cStack_25b = cVar71;
      cStack_25a = cVar73;
      bStack_259 = bVar74;
      local_258 = uVar18;
      local_238 = pos0_00;
      local_230 = pNVar31;
      local_228 = uVar35;
      do {
        iVar7 = 0;
        if (uVar15 != 0) {
          for (; (uVar15 >> iVar7 & 1) == 0; iVar7 = iVar7 + 1) {
          }
        }
        ppVar33 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>
                   *)((ulong)(uint)(iVar7 << 5) + lVar6 + (long)pgVar32 * 0x1e0);
        bVar14 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                           ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                            local_2b8,local_2c8,
                            (basic_string_view<char,_std::char_traits<char>_> *)ppVar33);
        if (bVar14) goto LAB_003dd37b;
        uVar15 = uVar15 - 1 & uVar15;
      } while (uVar15 != 0);
      bVar13 = *(byte *)(lVar27 + (long)pgVar32 * 0x10 + 0xf);
      uVar35 = local_228;
      pgVar32 = local_2a0;
      pNVar31 = local_230;
      uVar18 = local_258;
      pos0_00 = local_238;
      pbVar37 = local_2c8;
      cVar48 = (char)local_268;
      cVar50 = local_268._1_1_;
      cVar52 = local_268._2_1_;
      bVar53 = local_268._3_1_;
      cVar55 = local_268._4_1_;
      cVar57 = local_268._5_1_;
      cVar59 = local_268._6_1_;
      bVar60 = local_268._7_1_;
      cVar62 = cStack_260;
      cVar64 = cStack_25f;
      cVar66 = cStack_25e;
      bVar67 = bStack_25d;
      cVar69 = cStack_25c;
      cVar71 = cStack_25b;
      cVar73 = cStack_25a;
      bVar74 = bStack_259;
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[uVar35] & bVar13) == 0) break;
  }
  if (*(ulong *)&(this->assignments).field_0x138 < *(ulong *)&(this->assignments).field_0x130) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,256ul,16ul>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
              ((locator *)&local_280,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,256ul,16ul>>
                *)local_2b8,(arrays_type *)local_2b0,(size_t)pos0_00,uVar18,
               (try_emplace_args_t *)&local_298,pbVar37);
    puVar5 = &(this->assignments).field_0x138;
    *(long *)puVar5 = *(long *)puVar5 + 1;
    ppVar33 = local_270;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,256ul,16ul>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
              ((locator *)&local_280,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,256ul,16ul>>
                *)local_2b8,uVar18,(try_emplace_args_t *)&local_298,pbVar37);
    ppVar33 = local_270;
  }
LAB_003dd37b:
  (ppVar33->second).first = local_248;
  (ppVar33->second).second = SUB41(local_284,0);
LAB_003dd38f:
  pPVar34 = pPVar34 + 1;
  if (pPVar34 == local_2a8) goto LAB_003dcf0a;
  goto LAB_003dd042;
code_r0x003dcfa1:
  if (puVar20[-1] != '\x01') {
    iVar75.pc_ = puVar20 + -1;
    goto LAB_003dcf27;
  }
  goto LAB_003dcebc;
}

Assistant:

void ParameterBuilder::setAssignments(const ParameterValueAssignmentSyntax& syntax,
                                      bool isFromConfig) {
    // Special case for config param assignments: if the assignment
    // syntax list is empty, we set all params back to their defaults.
    if (isFromConfig && syntax.parameters.empty()) {
        assignments.clear();
        return;
    }

    // Build up data structures to easily index the parameter assignments. We need to handle
    // both ordered assignment as well as named assignment, though a specific instance can only
    // use one method or the other.
    bool hasParamAssignments = false;
    bool orderedAssignments = true;
    SmallVector<const OrderedParamAssignmentSyntax*> orderedParams;
    SmallMap<std::string_view, std::pair<const NamedParamAssignmentSyntax*, bool>, 8> namedParams;

    for (auto paramBase : syntax.parameters) {
        bool isOrdered = paramBase->kind == SyntaxKind::OrderedParamAssignment;
        if (!hasParamAssignments) {
            hasParamAssignments = true;
            orderedAssignments = isOrdered;
        }
        else if (isOrdered != orderedAssignments) {
            scope.addDiag(diag::MixingOrderedAndNamedParams, paramBase->getFirstToken().location());
            break;
        }

        if (isOrdered)
            orderedParams.push_back(&paramBase->as<OrderedParamAssignmentSyntax>());
        else {
            auto& nas = paramBase->as<NamedParamAssignmentSyntax>();
            auto name = nas.name.valueText();
            if (!name.empty()) {
                auto pair = namedParams.emplace(name, std::make_pair(&nas, false));
                if (!pair.second) {
                    auto& diag = scope.addDiag(diag::DuplicateParamAssignment, nas.name.location());
                    diag << name;
                    diag.addNote(diag::NotePreviousUsage,
                                 pair.first->second.first->name.location());
                }
            }
        }
    }

    // For each parameter assignment we have, match it up to a real parameter
    if (orderedAssignments) {
        uint32_t orderedIndex = 0;
        for (auto& param : parameterDecls) {
            if (orderedIndex >= orderedParams.size())
                break;

            if (param.isLocalParam)
                continue;

            assignments[param.name] = {orderedParams[orderedIndex++]->expr, isFromConfig};
        }

        // Make sure there aren't extra param assignments for non-existent params.
        if (orderedIndex < orderedParams.size()) {
            auto loc = orderedParams[orderedIndex]->getFirstToken().location();
            auto& diag = scope.addDiag(diag::TooManyParamAssignments, loc);
            diag << definitionName;
            diag << orderedParams.size();
            diag << orderedIndex;
        }
    }
    else {
        // Otherwise handle named assignments.
        for (auto& param : parameterDecls) {
            auto it = namedParams.find(param.name);
            if (it == namedParams.end())
                continue;

            auto arg = it->second.first;
            it->second.second = true;
            if (param.isLocalParam) {
                // Can't assign to localparams, so this is an error.
                DiagCode code = param.isPortParam ? diag::AssignedToLocalPortParam
                                                  : diag::AssignedToLocalBodyParam;

                auto& diag = scope.addDiag(code, arg->name.location());
                diag.addNote(diag::NoteDeclarationHere, param.location);
                continue;
            }

            assignments[param.name] = {arg->expr, isFromConfig};
        }

        for (auto& pair : namedParams) {
            // We marked all the args that we used, so anything left over is a param assignment
            // for a non-existent parameter.
            auto [argSyntax, used] = pair.second;
            if (!used) {
                auto& diag = scope.addDiag(diag::ParameterDoesNotExist, argSyntax->name.location());
                diag << argSyntax->name.valueText();
                diag << definitionName;
            }
        }
    }
}